

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5PutVarint64(uchar *p,u64 v)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  undefined1 *local_18;
  undefined2 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaaaa;
  if (v >> 0x38 == 0) {
    uVar2 = 0;
    do {
      uVar4 = uVar2;
      *(byte *)((long)&local_18 + uVar4) = (byte)v | 0x80;
      uVar2 = uVar4 + 1;
      bVar1 = 0x7f < v;
      v = v >> 7;
    } while (bVar1);
    local_18 = (undefined1 *)((ulong)local_18 & 0xffffffffffffff7f);
    uVar5 = uVar2;
    for (; uVar4 != 0xffffffffffffffff; uVar4 = uVar4 - 1) {
      uVar5 = uVar5 - 1;
      *p = *(uchar *)((long)&local_18 + (uVar5 & 0xffffffff));
      p = p + 1;
    }
  }
  else {
    p[8] = (uchar)v;
    uVar4 = v >> 8;
    uVar2 = 9;
    for (uVar3 = 7; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
      p[uVar3] = (byte)uVar4 | 0x80;
      uVar4 = uVar4 >> 7;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int FTS5_NOINLINE fts5PutVarint64(unsigned char *p, u64 v){
  int i, j, n;
  u8 buf[10];
  if( v & (((u64)0xff000000)<<32) ){
    p[8] = (u8)v;
    v >>= 8;
    for(i=7; i>=0; i--){
      p[i] = (u8)((v & 0x7f) | 0x80);
      v >>= 7;
    }
    return 9;
  }
  n = 0;
  do{
    buf[n++] = (u8)((v & 0x7f) | 0x80);
    v >>= 7;
  }while( v!=0 );
  buf[0] &= 0x7f;
  assert( n<=9 );
  for(i=0, j=n-1; j>=0; j--, i++){
    p[i] = buf[j];
  }
  return n;
}